

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O3

int x509_date_is_valid(mbedtls_x509_time *time)

{
  uint uVar1;
  int iVar2;
  
  iVar2 = -0x2400;
  if (((((uint)time->year < 10000) && ((uint)time->hour < 0x18)) && ((uint)time->min < 0x3c)) &&
     (((uint)time->sec < 0x3c && (uVar1 = time->mon, uVar1 < 0xd)))) {
    if ((0x15aaU >> (uVar1 & 0x1f) & 1) == 0) {
      if ((0xa50U >> (uVar1 & 0x1f) & 1) == 0) {
        if (uVar1 != 2) {
          return -0x2400;
        }
        if (time->day < 1) {
          return -0x2400;
        }
        if (((time->year & 3U) == 0) + 0x1c < (uint)time->day) {
          return -0x2400;
        }
      }
      else if (time->day - 0x1fU < 0xffffffe2) {
        return -0x2400;
      }
    }
    else if (time->day - 0x20U < 0xffffffe1) {
      return -0x2400;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int x509_date_is_valid(const mbedtls_x509_time *time)
{
    int ret = MBEDTLS_ERR_X509_INVALID_DATE;

    CHECK_RANGE( 0, 9999, time->year );
    CHECK_RANGE( 0, 23,   time->hour );
    CHECK_RANGE( 0, 59,   time->min  );
    CHECK_RANGE( 0, 59,   time->sec  );

    switch( time->mon )
    {
        case 1: case 3: case 5: case 7: case 8: case 10: case 12:
            CHECK_RANGE( 1, 31, time->day );
            break;
        case 4: case 6: case 9: case 11:
            CHECK_RANGE( 1, 30, time->day );
            break;
        case 2:
            CHECK_RANGE( 1, 28 + (time->year % 4 == 0), time->day );
            break;
        default:
            return( ret );
    }

    return( 0 );
}